

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

SyHashEntry * SyHashGet(SyHash *pHash,void *pKey,sxu32 nKeyLen)

{
  SyHashEntry *pSVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  sxu32 *psVar4;
  
  if ((nKeyLen != 0) && (pHash->nEntry != 0)) {
    sVar2 = (*pHash->xHash)(pKey,nKeyLen);
    psVar4 = (sxu32 *)(pHash->apBucket + (pHash->nBucketSize - 1 & sVar2));
    while( true ) {
      pSVar1 = *(SyHashEntry **)psVar4;
      if (pSVar1 == (SyHashEntry *)0x0) {
        return (SyHashEntry *)0x0;
      }
      if (((*(sxu32 *)&pSVar1[1].pKey == sVar2) && (pSVar1->nKeyLen == nKeyLen)) &&
         (sVar3 = (*pHash->xCmp)(pSVar1->pKey,pKey,nKeyLen), sVar3 == 0)) break;
      psVar4 = &pSVar1[2].nKeyLen;
    }
    return pSVar1;
  }
  return (SyHashEntry *)0x0;
}

Assistant:

JX9_PRIVATE SyHashEntry * SyHashGet(SyHash *pHash, const void *pKey, sxu32 nKeyLen)
{
	SyHashEntry_Pr *pEntry;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) ){
		return 0;
	}
#endif
	if( pHash->nEntry < 1 || nKeyLen < 1 ){
		/* Don't bother hashing, return immediately */
		return 0;
	}
	pEntry = HashGetEntry(&(*pHash), pKey, nKeyLen);
	if( pEntry == 0 ){
		return 0;
	}
	return (SyHashEntry *)pEntry;
}